

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr.c
# Opt level: O1

void * rtr_fsm_start(rtr_socket *rtr_socket)

{
  int iVar1;
  char *frmt;
  long in_FS_OFFSET;
  int oldcancelstate;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (rtr_socket->state == RTR_SHUTDOWN) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return (void *)0x0;
  }
  pthread_setcancelstate(1,&local_3c);
  rtr_socket->state = RTR_CONNECTING;
switchD_0010833e_default:
  switch(rtr_socket->state) {
  case RTR_CONNECTING:
    lrtr_dbg("RTR Socket: State: RTR_CONNECTING");
    rtr_socket->has_received_pdus = false;
    rtr_purge_outdated_records(rtr_socket);
    iVar1 = tr_open(rtr_socket->tr_socket);
    if (iVar1 == -1) {
      rtr_change_socket_state(rtr_socket,RTR_ERROR_TRANSPORT);
      goto switchD_0010833e_default;
    }
    if (rtr_socket->request_session_id == true) {
      rtr_change_socket_state(rtr_socket,RTR_RESET);
      goto switchD_0010833e_default;
    }
    iVar1 = rtr_send_serial_query(rtr_socket);
    if (iVar1 != 0) {
      rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
      goto switchD_0010833e_default;
    }
    break;
  case RTR_ESTABLISHED:
    lrtr_dbg("RTR Socket: State: RTR_ESTABLISHED");
    pthread_setcancelstate(0,&local_3c);
    iVar1 = rtr_wait_for_sync(rtr_socket);
    pthread_setcancelstate(1,&local_3c);
    if ((iVar1 != 0) || (iVar1 = rtr_send_serial_query(rtr_socket), iVar1 != 0))
    goto switchD_0010833e_default;
    break;
  case RTR_RESET:
    lrtr_dbg("RTR Socket: State: RTR_RESET");
    iVar1 = rtr_send_reset_query(rtr_socket);
    if (iVar1 != 0) goto switchD_0010833e_default;
    lrtr_dbg("RTR Socket: rtr_start: reset pdu sent");
    break;
  case RTR_SYNC:
    lrtr_dbg("RTR Socket: State: RTR_SYNC");
    iVar1 = rtr_sync(rtr_socket);
    if (iVar1 == 0) {
      rtr_change_socket_state(rtr_socket,RTR_ESTABLISHED);
    }
    goto switchD_0010833e_default;
  case RTR_FAST_RECONNECT:
    lrtr_dbg("RTR Socket: State: RTR_FAST_RECONNECT");
    tr_close(rtr_socket->tr_socket);
    rtr_change_socket_state(rtr_socket,RTR_CONNECTING);
    goto switchD_0010833e_default;
  case RTR_ERROR_NO_DATA_AVAIL:
    lrtr_dbg("RTR Socket: State: RTR_ERROR_NO_DATA_AVAIL");
    rtr_socket->request_session_id = true;
    rtr_socket->serial_number = 0;
    rtr_change_socket_state(rtr_socket,RTR_RESET);
    sleep(rtr_socket->retry_interval);
    goto LAB_001084b7;
  case RTR_ERROR_NO_INCR_UPDATE_AVAIL:
    lrtr_dbg("RTR Socket: State: RTR_ERROR_NO_INCR_UPDATE_AVAIL");
    rtr_socket->request_session_id = true;
    rtr_socket->serial_number = 0;
    rtr_change_socket_state(rtr_socket,RTR_RESET);
LAB_001084b7:
    rtr_purge_outdated_records(rtr_socket);
    goto switchD_0010833e_default;
  case RTR_ERROR_FATAL:
    frmt = "RTR Socket: State: RTR_ERROR_FATAL";
    goto LAB_001084c7;
  case RTR_ERROR_TRANSPORT:
    frmt = "RTR Socket: State: RTR_ERROR_TRANSPORT";
LAB_001084c7:
    lrtr_dbg(frmt);
    tr_close(rtr_socket->tr_socket);
    rtr_change_socket_state(rtr_socket,RTR_CONNECTING);
    lrtr_dbg("RTR Socket: Waiting %u",(ulong)rtr_socket->retry_interval);
    pthread_setcancelstate(0,&local_3c);
    sleep(rtr_socket->retry_interval);
    pthread_setcancelstate(1,&local_3c);
    goto switchD_0010833e_default;
  case RTR_SHUTDOWN:
    goto switchD_0010833e_caseD_9;
  default:
    goto switchD_0010833e_default;
  }
  rtr_change_socket_state(rtr_socket,RTR_SYNC);
  goto switchD_0010833e_default;
switchD_0010833e_caseD_9:
  lrtr_dbg("RTR Socket: State: RTR_SHUTDOWN");
  pthread_exit((void *)0x0);
}

Assistant:

void *rtr_fsm_start(struct rtr_socket *rtr_socket)
{
	if (rtr_socket->state == RTR_SHUTDOWN)
		return NULL;

	// We don't care about the old state, but POSIX demands a non null value for setcancelstate
	int oldcancelstate;

	pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, &oldcancelstate);

	rtr_socket->state = RTR_CONNECTING;
	while (1) {
		if (rtr_socket->state == RTR_CONNECTING) {
			RTR_DBG1("State: RTR_CONNECTING");
			rtr_socket->has_received_pdus = false;

			// old pfx_record could exists in the pfx_table, check if they are too old and must be removed
			// old key_entry could exists in the spki_table, check if they are too old and must be removed
			// old aspa_Record could exists in the aspa_table, check if they are too old and must be removed
			rtr_purge_outdated_records(rtr_socket);

			if (tr_open(rtr_socket->tr_socket) == TR_ERROR) {
				rtr_change_socket_state(rtr_socket, RTR_ERROR_TRANSPORT);
			} else if (rtr_socket->request_session_id) {
				// change to state RESET, if socket doesn't have a session_id
				rtr_change_socket_state(rtr_socket, RTR_RESET);
			} else {
				// if we already have a session_id, send a serial query and start to sync
				if (rtr_send_serial_query(rtr_socket) == RTR_SUCCESS)
					rtr_change_socket_state(rtr_socket, RTR_SYNC);
				else
					rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
			}
		}

		else if (rtr_socket->state == RTR_RESET) {
			RTR_DBG1("State: RTR_RESET");
			if (rtr_send_reset_query(rtr_socket) == RTR_SUCCESS) {
				RTR_DBG1("rtr_start: reset pdu sent");
				rtr_change_socket_state(rtr_socket,
							RTR_SYNC); // start to sync after connection is established
			}
		}

		else if (rtr_socket->state == RTR_SYNC) {
			RTR_DBG1("State: RTR_SYNC");
			if (rtr_sync(rtr_socket) == RTR_SUCCESS)
				rtr_change_socket_state(
					rtr_socket,
					RTR_ESTABLISHED); // wait for next sync after first successful sync
		}

		else if (rtr_socket->state == RTR_ESTABLISHED) {
			RTR_DBG1("State: RTR_ESTABLISHED");

			// Allow thread cancellation for recv code path only.
			// This should be enough since we spend most of the time blocking on recv
			pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, &oldcancelstate);
			int ret = rtr_wait_for_sync(
				rtr_socket); // blocks till expire_interval is expired or PDU was received
			pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, &oldcancelstate);

			if (ret == RTR_SUCCESS) { // send serial query
				if (rtr_send_serial_query(rtr_socket) == RTR_SUCCESS)
					rtr_change_socket_state(rtr_socket, RTR_SYNC);
			}
		}

		else if (rtr_socket->state == RTR_FAST_RECONNECT) {
			RTR_DBG1("State: RTR_FAST_RECONNECT");
			tr_close(rtr_socket->tr_socket);
			rtr_change_socket_state(rtr_socket, RTR_CONNECTING);
		}

		else if (rtr_socket->state == RTR_ERROR_NO_DATA_AVAIL) {
			RTR_DBG1("State: RTR_ERROR_NO_DATA_AVAIL");
			rtr_socket->request_session_id = true;
			rtr_socket->serial_number = 0;
			rtr_change_socket_state(rtr_socket, RTR_RESET);
			sleep(rtr_socket->retry_interval);
			rtr_purge_outdated_records(rtr_socket);
		}

		else if (rtr_socket->state == RTR_ERROR_NO_INCR_UPDATE_AVAIL) {
			RTR_DBG1("State: RTR_ERROR_NO_INCR_UPDATE_AVAIL");
			rtr_socket->request_session_id = true;
			rtr_socket->serial_number = 0;
			rtr_change_socket_state(rtr_socket, RTR_RESET);
			rtr_purge_outdated_records(rtr_socket);
		}

		else if (rtr_socket->state == RTR_ERROR_TRANSPORT) {
			RTR_DBG1("State: RTR_ERROR_TRANSPORT");
			tr_close(rtr_socket->tr_socket);
			rtr_change_socket_state(rtr_socket, RTR_CONNECTING);
			RTR_DBG("Waiting %u", rtr_socket->retry_interval);
			pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, &oldcancelstate);
			sleep(rtr_socket->retry_interval);
			pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, &oldcancelstate);
		}

		else if (rtr_socket->state == RTR_ERROR_FATAL) {
			RTR_DBG1("State: RTR_ERROR_FATAL");
			tr_close(rtr_socket->tr_socket);
			rtr_change_socket_state(rtr_socket, RTR_CONNECTING);
			RTR_DBG("Waiting %u", rtr_socket->retry_interval);
			pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, &oldcancelstate);
			sleep(rtr_socket->retry_interval);
			pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, &oldcancelstate);
		}

		else if (rtr_socket->state == RTR_SHUTDOWN) {
			RTR_DBG1("State: RTR_SHUTDOWN");
			pthread_exit(NULL);
		}
	}
}